

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O3

QVariant * __thiscall
QInputMethodQueryEvent::value
          (QVariant *__return_storage_ptr__,QInputMethodQueryEvent *this,InputMethodQuery query)

{
  long lVar1;
  QVariant *pQVar2;
  
  lVar1 = (this->m_values).d.size;
  if (lVar1 != 0) {
    pQVar2 = &((this->m_values).d.ptr)->value;
    do {
      if (*(InputMethodQuery *)((long)(pQVar2 + -1) + 0x18) == query) {
        ::QVariant::QVariant(__return_storage_ptr__,pQVar2);
        return __return_storage_ptr__;
      }
      pQVar2 = (QVariant *)((long)(pQVar2 + 1) + 8);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QInputMethodQueryEvent::value(Qt::InputMethodQuery query) const
{
    for (int i = 0; i < m_values.size(); ++i)
        if (m_values.at(i).query == query)
            return m_values.at(i).value;
    return QVariant();
}